

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_cb_thrdpool.c
# Opt level: O0

void * uo_cb_manage_thrds(void *arg)

{
  double dVar1;
  atomic_size_t aVar2;
  int iVar3;
  ulong uVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  size_t local_f8;
  size_t local_f0;
  double local_e0;
  double local_d0;
  _Bool was_correct;
  size_t prev_weighted_throughput;
  size_t completions;
  undefined1 local_58 [8];
  timespec abs_timeout;
  UO_CB_THRD_STATE thrd_state;
  long local_30;
  size_t pause_counter;
  double duration_msec;
  size_t count;
  size_t thrd_i;
  void *arg_local;
  
  thrdpool.thrd_count_target = 4;
  count = 0;
  duration_msec = (double)thrdpool.thrd_count;
  pause_counter = 0x407f400000000000;
  local_30 = 100;
  while (((is_quitting ^ 0xffU) & 1) != 0) {
    while( true ) {
      bVar5 = false;
      if (((is_quitting & 1U) == 0) &&
         (bVar5 = false, (ulong)duration_msec < thrdpool.thrd_count_target)) {
        bVar5 = (ulong)duration_msec < 0x10;
      }
      if (!bVar5) break;
      LOCK();
      UNLOCK();
      duration_msec = (double)(thrdpool.thrd_count + 1);
      thrdpool.thrd_count = thrdpool.thrd_count + 1;
      for (; abs_timeout.tv_nsec._4_4_ = thrdpool.cb_thrds[count].state,
          abs_timeout.tv_nsec._4_4_ != UO_CB_THRD_UNINITIALIZED; count = count + 1 & 0xf) {
        if (abs_timeout.tv_nsec._4_4_ == UO_CB_THRD_EXITED) {
          pthread_join(thrdpool.cb_thrds[count].thrd,(void **)0x0);
          thrdpool.cb_thrds[count].state = UO_CB_THRD_UNINITIALIZED;
        }
      }
      thrdpool.cb_thrds[count].state = UO_CB_THRD_RUNNING;
      pthread_create(&thrdpool.cb_thrds[count].thrd,(pthread_attr_t *)0x0,uo_cb_execute,
                     (void *)count);
    }
    clock_gettime(0,(timespec *)local_58);
    timespec_add_ms((timespec *)local_58,(double)pause_counter);
    iVar3 = sem_timedwait((sem_t *)&thrdpool.update_sem,(timespec *)local_58);
    aVar2 = thrdpool.sample.completions;
    if (iVar3 != 0) {
      if (thrdpool.executing_count == 0) {
        local_30 = local_30 + -1;
        if (local_30 == 0) {
          if (thrdpool.thrd_count_target < 3) {
            sem_wait((sem_t *)&thrdpool.update_sem);
          }
          else {
            thrdpool.thrd_count_target = thrdpool.thrd_count_target - 1;
            pause_counter = (size_t)((double)pause_counter * 1.5);
          }
          local_30 = 100;
        }
        LOCK();
        thrdpool.sample.completions = 0;
        UNLOCK();
      }
      else {
        LOCK();
        thrdpool.sample.completions = 0;
        UNLOCK();
        uVar4 = (long)thrdpool.sample.weighted_throughput |
                (long)(thrdpool.sample.weighted_throughput - 9.223372036854776e+18) &
                (long)thrdpool.sample.weighted_throughput >> 0x3f;
        auVar6._8_4_ = (int)(aVar2 >> 0x20);
        auVar6._0_8_ = aVar2;
        auVar6._12_4_ = 0x45300000;
        auVar7._8_4_ = (int)(thrdpool.thrd_count_target >> 0x20);
        auVar7._0_8_ = thrdpool.thrd_count_target;
        auVar7._12_4_ = 0x45300000;
        dVar1 = pow(0.95,(auVar7._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)thrdpool.thrd_count_target) -
                         4503599627370496.0));
        thrdpool.sample.weighted_throughput =
             (((auVar6._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)aVar2) - 4503599627370496.0)) /
             (double)pause_counter) * dVar1;
        auVar8._8_4_ = (int)(uVar4 >> 0x20);
        auVar8._0_8_ = uVar4;
        auVar8._12_4_ = 0x45300000;
        bVar5 = (auVar8._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0) <
                thrdpool.sample.weighted_throughput;
        thrdpool.sample.thrd_target_increase =
             (_Bool)((bVar5 != (bool)(thrdpool.sample.thrd_target_increase & 1U) ^ 0xffU) & 1);
        if (thrdpool.sample.thrd_target_increase == false) {
          if (thrdpool.thrd_count_target < 3) {
            pause_counter = (size_t)((double)pause_counter * 1.5);
          }
          else {
            thrdpool.thrd_count_target = thrdpool.thrd_count_target - 1;
            local_e0 = 0.8;
            if (!bVar5) {
              local_e0 = 1.5;
            }
            pause_counter = (size_t)(local_e0 * (double)pause_counter);
          }
        }
        else if (thrdpool.thrd_count_target < 0x10) {
          thrdpool.thrd_count_target = thrdpool.thrd_count_target + 1;
          local_d0 = 0.8;
          if (!bVar5) {
            local_d0 = 1.5;
          }
          pause_counter = (size_t)(local_d0 * (double)pause_counter);
        }
        else {
          pause_counter = (size_t)((double)pause_counter * 1.5);
        }
      }
      if ((double)pause_counter <= 5000.0) {
        if (10.0 <= (double)pause_counter) {
          local_f8 = pause_counter;
        }
        else {
          local_f8 = 0x4024000000000000;
        }
        local_f0 = local_f8;
      }
      else {
        local_f0 = 0x40b3880000000000;
      }
      pause_counter = local_f0;
    }
  }
  return (void *)0x0;
}

Assistant:

static void *uo_cb_manage_thrds(
    void *arg)
{
    thrdpool.thrd_count_target = UO_CB_THRD_COUNT_INI;

    size_t thrd_i = 0;
    size_t count = thrdpool.thrd_count;

    double duration_msec = UO_CB_THRDPOOL_TIMEO_INI;
    size_t pause_counter = UO_CB_THRDPOOL_PAUSE_COUNTER;

    while (!is_quitting)
    {
        while (!is_quitting && count < thrdpool.thrd_count_target && count < UO_CB_THRD_COUNT_MAX)
        {
            count = atomic_fetch_add(&thrdpool.thrd_count, 1) + 1;

            enum UO_CB_THRD_STATE thrd_state;

            while (thrd_state = thrdpool.cb_thrds[thrd_i].state)
            {
                if (thrd_state == UO_CB_THRD_EXITED)
                {
                    pthread_join(thrdpool.cb_thrds[thrd_i].thrd, NULL);
                    thrdpool.cb_thrds[thrd_i].state = UO_CB_THRD_UNINITIALIZED;
                }

                ++thrd_i;
                thrd_i %= UO_CB_THRD_COUNT_MAX;
            }

            thrdpool.cb_thrds[thrd_i].state = UO_CB_THRD_RUNNING;
            
            pthread_create(&thrdpool.cb_thrds[thrd_i].thrd, 0, uo_cb_execute, (void *)(uintptr_t)thrd_i);
        }

        struct timespec abs_timeout;
        clock_gettime(CLOCK_REALTIME, &abs_timeout);
        timespec_add_ms(&abs_timeout, duration_msec);

        if (sem_timedwait(&thrdpool.update_sem, &abs_timeout) != 0)
        {
            if (atomic_load(&thrdpool.executing_count))
            {
                size_t completions = atomic_exchange(&thrdpool.sample.completions, 0);

                size_t prev_weighted_throughput = thrdpool.sample.weighted_throughput;
                thrdpool.sample.weighted_throughput = completions / duration_msec * pow(1.0 - UO_CB_THRDPOOL_COST_PER_THRD, thrdpool.thrd_count_target);

                bool was_correct = thrdpool.sample.weighted_throughput > prev_weighted_throughput;
                thrdpool.sample.thrd_target_increase = !(was_correct ^ thrdpool.sample.thrd_target_increase);
                
                if (thrdpool.sample.thrd_target_increase)
                {
                    if (thrdpool.thrd_count_target < UO_CB_THRD_COUNT_MAX)
                    {
                        ++thrdpool.thrd_count_target;
                        duration_msec *= was_correct ? UO_CB_THRDPOOL_TIMEO_DEC_FACTOR : UO_CB_THRDPOOL_TIMEO_INC_FACTOR;
                    }
                    else
                        duration_msec *= UO_CB_THRDPOOL_TIMEO_INC_FACTOR;
                }
                else
                {
                    if (thrdpool.thrd_count_target > UO_CB_THRD_COUNT_MIN)
                    {
                        --thrdpool.thrd_count_target;
                        duration_msec *= was_correct ? UO_CB_THRDPOOL_TIMEO_DEC_FACTOR : UO_CB_THRDPOOL_TIMEO_INC_FACTOR;
                    }
                    else
                        duration_msec *= UO_CB_THRDPOOL_TIMEO_INC_FACTOR;
                }
            }
            else
            {
                if (--pause_counter == 0)
                {
                    if (thrdpool.thrd_count_target > UO_CB_THRD_COUNT_MIN)
                    {
                        --thrdpool.thrd_count_target;
                        duration_msec *= UO_CB_THRDPOOL_TIMEO_INC_FACTOR;
                    }
                    else
                        sem_wait(&thrdpool.update_sem);

                    pause_counter = UO_CB_THRDPOOL_PAUSE_COUNTER;
                }
                
                atomic_store(&thrdpool.sample.completions, 0);
            }

            duration_msec = duration_msec > UO_CB_THRDPOOL_TIMEO_MAX
                ? UO_CB_THRDPOOL_TIMEO_MAX
                : duration_msec < UO_CB_THRDPOOL_TIMEO_MIN
                    ? UO_CB_THRDPOOL_TIMEO_MIN
                    : duration_msec;
        }
    }

    return NULL;
}